

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmTarget *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  bool local_151;
  byte local_115;
  allocator local_109;
  string local_108;
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  char *local_70;
  char *xcodeVersion;
  byte local_52;
  allocator local_51;
  string local_50;
  cmMakefile *local_30;
  cmMakefile *mf;
  string *toDestDirPath_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  mf = (cmMakefile *)toDestDirPath;
  toDestDirPath_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  local_30 = cmTarget::GetMakefile(this->Target->Target);
  bVar2 = cmMakefile::PlatformIsAppleIos(local_30);
  pcVar1 = local_30;
  local_52 = 0;
  xcodeVersion._3_1_ = 0;
  local_115 = 1;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string((string *)&local_50,"XCODE",&local_51);
    xcodeVersion._3_1_ = 1;
    bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
    local_115 = bVar2 ^ 0xff;
  }
  if ((xcodeVersion._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  pcVar1 = local_30;
  if ((local_115 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"XCODE_VERSION",&local_91);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_ba = 0;
    local_bb = 0;
    local_e2 = 0;
    local_e3 = 0;
    local_151 = true;
    local_70 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string((string *)&local_b8,"6",&local_b9);
      pcVar4 = local_70;
      local_bb = 1;
      std::allocator<char>::allocator();
      local_e2 = 1;
      std::__cxx11::string::string((string *)&local_e0,pcVar4,&local_e1);
      local_e3 = 1;
      local_151 = cmSystemTools::VersionCompareGreater(&local_b8,&local_e0);
    }
    if ((local_e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if ((local_e2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    if ((local_bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_ba & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    if ((local_151 == false) &&
       (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 < OBJECT_LIBRARY)) {
      this_00 = this->Target->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"IOS_INSTALL_COMBINED",&local_109);
      bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        poVar5 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar5,"include(CMakeIOSInstallCombined)\n");
        poVar5 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        poVar5 = std::operator<<(poVar5,"ios_install_combined(");
        poVar5 = std::operator<<(poVar5,"\"");
        psVar6 = cmTarget::GetName_abi_cxx11_(this->Target->Target);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" ");
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5,(string *)mf);
        std::operator<<(poVar5,"\")\n");
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleIos() || !mf->IsOn("XCODE")) {
    return;
  }

  const char* xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}